

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_4_channels_with_4_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *local_1f0;
  float *local_1d8;
  stbir__contributors *local_1d0;
  float fStack_11c;
  float fStack_110;
  float fStack_104;
  float local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float fStack_88;
  float fStack_84;
  __m128 cs;
  __m128 c;
  __m128 tot1;
  __m128 tot0;
  float *hc;
  float *decode;
  float *output;
  float *output_end;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  
  local_1f0 = output_buffer;
  local_1d8 = horizontal_coefficients;
  local_1d0 = horizontal_contributors;
  do {
    pfVar1 = decode_buffer + (local_1d0->n0 << 2);
    local_f8 = (float)*(undefined8 *)local_1d8;
    fStack_88 = (float)*(undefined8 *)pfVar1;
    fStack_84 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
    cs[0] = (float)*(undefined8 *)(pfVar1 + 2);
    cs[1] = (float)((ulong)*(undefined8 *)(pfVar1 + 2) >> 0x20);
    fStack_104 = (float)((ulong)*(undefined8 *)local_1d8 >> 0x20);
    local_a8 = (float)*(undefined8 *)(pfVar1 + 4);
    fStack_a4 = (float)((ulong)*(undefined8 *)(pfVar1 + 4) >> 0x20);
    fStack_a0 = (float)*(undefined8 *)(pfVar1 + 6);
    fStack_9c = (float)((ulong)*(undefined8 *)(pfVar1 + 6) >> 0x20);
    fStack_110 = (float)*(undefined8 *)(local_1d8 + 2);
    local_c8 = (float)*(undefined8 *)(pfVar1 + 8);
    fStack_c4 = (float)((ulong)*(undefined8 *)(pfVar1 + 8) >> 0x20);
    fStack_c0 = (float)*(undefined8 *)(pfVar1 + 10);
    fStack_bc = (float)((ulong)*(undefined8 *)(pfVar1 + 10) >> 0x20);
    fStack_11c = (float)((ulong)*(undefined8 *)(local_1d8 + 2) >> 0x20);
    local_e8 = (float)*(undefined8 *)(pfVar1 + 0xc);
    fStack_e4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0xc) >> 0x20);
    fStack_e0 = (float)*(undefined8 *)(pfVar1 + 0xe);
    fStack_dc = (float)((ulong)*(undefined8 *)(pfVar1 + 0xe) >> 0x20);
    *(ulong *)local_1f0 =
         CONCAT44(local_f8 * fStack_84 + fStack_110 * fStack_c4 +
                  fStack_104 * fStack_a4 + fStack_11c * fStack_e4,
                  local_f8 * fStack_88 + fStack_110 * local_c8 +
                  fStack_104 * local_a8 + fStack_11c * local_e8);
    *(ulong *)(local_1f0 + 2) =
         CONCAT44(local_f8 * cs[1] + fStack_110 * fStack_bc +
                  fStack_104 * fStack_9c + fStack_11c * fStack_dc,
                  local_f8 * cs[0] + fStack_110 * fStack_c0 +
                  fStack_104 * fStack_a0 + fStack_11c * fStack_e0);
    local_1d8 = local_1d8 + coefficient_width;
    local_1d0 = local_1d0 + 1;
    local_1f0 = local_1f0 + 4;
  } while (local_1f0 < output_buffer + (output_sub_size << 2));
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_4_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__store_output();
  } while ( output < output_end );
}